

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void RangeEnc_Encode(CPpmd7z_RangeEnc *p,UInt32 start,UInt32 size,UInt32 total)

{
  uint in_ECX;
  uint uVar1;
  int in_EDX;
  int in_ESI;
  CPpmd7z_RangeEnc *in_RDI;
  CPpmd7z_RangeEnc *p_00;
  
  uVar1 = in_RDI->Range / in_ECX;
  in_RDI->Range = uVar1;
  in_RDI->Low = (ulong)(in_ESI * uVar1) + in_RDI->Low;
  in_RDI->Range = in_EDX * in_RDI->Range;
  p_00 = in_RDI;
  while (in_RDI->Range < 0x1000000) {
    in_RDI->Range = in_RDI->Range << 8;
    RangeEnc_ShiftLow(p_00);
  }
  return;
}

Assistant:

static void RangeEnc_Encode(CPpmd7z_RangeEnc *p, UInt32 start, UInt32 size, UInt32 total)
{
  p->Low += start * (p->Range /= total);
  p->Range *= size;
  while (p->Range < kTopValue)
  {
    p->Range <<= 8;
    RangeEnc_ShiftLow(p);
  }
}